

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test.cpp
# Opt level: O3

void __thiscall
MergeTest_MergeCompareTime_Test_Test::TestBody(MergeTest_MergeCompareTime_Test_Test *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  HeapType HVar4;
  unsigned_long __res;
  ulong uVar5;
  int *__s;
  result_type rVar6;
  clock_t cVar7;
  clock_t cVar8;
  ostream *poVar9;
  size_t __i;
  long lVar10;
  value_type_conflict1 *__val;
  int numHeap;
  int iVar11;
  char *in_R9;
  int elem;
  long lVar12;
  int numHeap_1;
  int *piVar13;
  AssertionResult gtest_ar_;
  HeapList tested;
  FoolHeapList fool;
  mt19937 generator;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1448;
  int *local_1440;
  internal local_1438 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1430;
  HeapList local_1428;
  string local_1400;
  AssertHelper local_13e0;
  HeapList local_13d8;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  local_13b8._M_x[0] = time((time_t *)0x0);
  local_13b8._M_x[0] = local_13b8._M_x[0] & 0xffffffff;
  lVar10 = 1;
  uVar5 = local_13b8._M_x[0];
  do {
    uVar5 = (ulong)(((uint)(uVar5 >> 0x1e) ^ (uint)uVar5) * 0x6c078965 + (int)lVar10);
    local_13b8._M_x[lVar10] = uVar5;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x270);
  local_13b8._M_p = 0x270;
  __s = (int *)operator_new(4000000);
  lVar10 = 0;
  memset(__s,0,4000000);
  do {
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&local_13b8);
    __s[lVar10] = (int)rVar6;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 1000000);
  HVar4 = Binomial;
  local_1440 = __s;
  do {
    local_13d8.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_13d8.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_13d8.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_13d8.TYPE = Fool;
    HeapList::AddHeap(&local_13d8,*__s);
    local_1428.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1428.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1428.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1428.TYPE = HVar4;
    for (lVar10 = 1; lVar10 != 1000000; lVar10 = lVar10 + 1) {
      (**(*local_13d8.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
           super__Vector_impl_data._M_start)->_vptr_IHeap)
                (*local_13d8.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
                  super__Vector_impl_data._M_start,(ulong)(uint)__s[lVar10]);
    }
    lVar10 = 0;
    piVar13 = __s;
    do {
      HeapList::AddHeap(&local_1428,__s[lVar10 * 1000]);
      lVar12 = 1;
      do {
        (**local_1428.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
           super__Vector_impl_data._M_start[lVar10]->_vptr_IHeap)
                  (local_1428.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar10],(ulong)(uint)piVar13[lVar12]);
        __s = local_1440;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 1000);
      lVar10 = lVar10 + 1;
      piVar13 = piVar13 + 1000;
    } while (lVar10 != 1000);
    lVar10 = 1;
    cVar7 = clock();
    do {
      (*(*local_1428.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
          super__Vector_impl_data._M_start)->_vptr_IHeap[3])
                (*local_1428.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
                  super__Vector_impl_data._M_start,
                 local_1428.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar10]);
      local_1428.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
      super__Vector_impl_data._M_start[lVar10] = (IHeap *)0x0;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 1000);
    cVar8 = clock();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"time of merging for heap of type ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,HVar4);
    local_1400._M_dataplus._M_p._0_1_ = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_1400,1);
    poVar9 = std::ostream::_M_insert<double>((double)(cVar8 - cVar7) / 1000000.0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    iVar11 = 1000000;
    do {
      iVar2 = HeapList::ExtractMin(&local_13d8,0);
      iVar3 = HeapList::ExtractMin(&local_1428,0);
      local_1438[0] = (internal)(iVar2 == iVar3);
      local_1430.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_1438[0]) {
        testing::Message::Message((Message *)&local_1448);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_1400,local_1438,
                   (AssertionResult *)"fool.ExtractMin(0) == tested.ExtractMin(0)","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_13e0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/edgarshmavonyan[P]mergeable_heaps/unit_test.cpp"
                   ,0xa2,(char *)CONCAT71(local_1400._M_dataplus._M_p._1_7_,
                                          local_1400._M_dataplus._M_p._0_1_));
        testing::internal::AssertHelper::operator=(&local_13e0,(Message *)&local_1448);
        testing::internal::AssertHelper::~AssertHelper(&local_13e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_1400._M_dataplus._M_p._1_7_,local_1400._M_dataplus._M_p._0_1_) !=
            &local_1400.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_1400._M_dataplus._M_p._1_7_,
                                   local_1400._M_dataplus._M_p._0_1_));
        }
        if (local_1448.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_1448.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_1448.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_1430,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      iVar11 = iVar11 + -1;
    } while (iVar11 != 0);
    HeapList::~HeapList(&local_1428);
    HeapList::~HeapList(&local_13d8);
    HVar4 = HVar4 + Leftist;
  } while (HVar4 != Fool);
  operator_delete(__s);
  return;
}

Assistant:

TEST(MergeTest, MergeCompareTime_Test) {
    // 1000 heaps with 1000 keys
    std::mt19937 generator(time(0));
    const size_t size = 1000, number = 1000;
    std::vector<int> values(number*size);
    for (int i = 0; i < size * number; i++) {
        values[i] = generator();
    }

    // in order to test binomial, skew and leftist we create 1 fool heap with size * number
    // keys as merging would be too slow
    // it does not change the correctness of the test

    for (int type = 0; type < 3; type++) {
        FoolHeapList fool;
        fool.AddHeap(values[0]);
        HeapList tested(type);

        for (int i = 0; i < size * number - 1; i++)
            fool.Insert(0, values[i + 1]);

        for (int numHeap = 0; numHeap < number; numHeap++) {
            tested.AddHeap(values[numHeap * 1000]);

            for (int elem = 1; elem < size; elem++)
                tested.Insert(numHeap, values[numHeap * 1000 + elem]);
        }

        clock_t t = clock();

        for (int numHeap = 1; numHeap < number; numHeap++) {
            tested.Meld(0, numHeap);
        }

        t = clock() - t;

        std::cout << "time of merging for heap of type " << type << ' ' << double(t) / CLOCKS_PER_SEC << std::endl;

        for (int i = 0; i < size * number; i++) {
            EXPECT_TRUE(fool.ExtractMin(0) == tested.ExtractMin(0));
        }
    }
}